

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int decode_gost_algor_params(EVP_PKEY *pkey,X509_ALGOR *palg)

{
  int iVar1;
  GOST_KEY_PARAMS *file;
  X509_ALGOR *in_RSI;
  EVP_PKEY *in_RDI;
  GOST_KEY_PARAMS *gkp;
  uchar *p;
  ASN1_STRING *pval;
  int param_nid;
  int pkey_nid;
  int ptype;
  ASN1_OBJECT *palg_obj;
  char *file_00;
  undefined8 in_stack_ffffffffffffffc0;
  GOST_KEY_PARAMS *a;
  EVP_PKEY *pkey_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  int iVar3;
  ASN1_OBJECT *o;
  int local_4;
  
  o = (ASN1_OBJECT *)0x0;
  iVar3 = -1;
  uVar2 = 0;
  pkey_00 = (EVP_PKEY *)0x0;
  file_00 = (char *)0x0;
  if ((in_RDI == (EVP_PKEY *)0x0) || (in_RSI == (X509_ALGOR *)0x0)) {
    local_4 = 0;
  }
  else {
    X509_ALGOR_get0((ASN1_OBJECT **)&stack0xffffffffffffffe0,(int *)&stack0xffffffffffffffdc,
                    (void **)&stack0xffffffffffffffc8,in_RSI);
    if (iVar3 == 0x10) {
      a = *(GOST_KEY_PARAMS **)(pkey_00 + 8);
      iVar1 = OBJ_obj2nid(o);
      file = d2i_GOST_KEY_PARAMS((GOST_KEY_PARAMS **)o,(uchar **)CONCAT44(iVar3,iVar1),
                                 CONCAT44(uVar2,in_stack_ffffffffffffffd0));
      if (file == (GOST_KEY_PARAMS *)0x0) {
        ERR_GOST_error((int)((ulong)a >> 0x20),(int)a,(char *)0x0,0);
        local_4 = 0;
      }
      else {
        OBJ_obj2nid((ASN1_OBJECT *)file->key_params);
        GOST_KEY_PARAMS_free(a);
        iVar3 = EVP_PKEY_set_type(in_RDI,iVar1);
        iVar1 = (int)((ulong)a >> 0x20);
        if (iVar3 == 0) {
          ERR_GOST_error(iVar1,(int)a,(char *)file,0);
          local_4 = 0;
        }
        else {
          local_4 = gost_decode_nid_params(pkey_00,iVar1,(int)a);
        }
      }
    }
    else {
      ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                     file_00,0);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int decode_gost_algor_params(EVP_PKEY *pkey,
                                    const X509_ALGOR *palg)
{
    const ASN1_OBJECT *palg_obj = NULL;
    int ptype = V_ASN1_UNDEF;
    int pkey_nid = NID_undef, param_nid = NID_undef;
    ASN1_STRING *pval = NULL;
    const unsigned char *p;
    GOST_KEY_PARAMS *gkp = NULL;

    if (!pkey || !palg)
        return 0;
    X509_ALGOR_get0(&palg_obj, &ptype, (const void **)&pval, palg);
    if (ptype != V_ASN1_SEQUENCE) {
        GOSTerr(GOST_F_DECODE_GOST_ALGOR_PARAMS,
                GOST_R_BAD_KEY_PARAMETERS_FORMAT);
        return 0;
    }
    p = pval->data;
    pkey_nid = OBJ_obj2nid(palg_obj);

    gkp = d2i_GOST_KEY_PARAMS(NULL, &p, pval->length);
    if (!gkp) {
        GOSTerr(GOST_F_DECODE_GOST_ALGOR_PARAMS,
                GOST_R_BAD_PKEY_PARAMETERS_FORMAT);
        return 0;
    }
    param_nid = OBJ_obj2nid(gkp->key_params);
    GOST_KEY_PARAMS_free(gkp);
    if (!EVP_PKEY_set_type(pkey, pkey_nid)) {
        GOSTerr(GOST_F_DECODE_GOST_ALGOR_PARAMS, ERR_R_INTERNAL_ERROR);
        return 0;
    }
    return gost_decode_nid_params(pkey, pkey_nid, param_nid);
}